

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.l.cpp
# Opt level: O0

int __thiscall deci_FlexLexer::yy_get_next_buffer(deci_FlexLexer *this)

{
  yy_buffer_state *pyVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  int new_size_1;
  int new_size;
  int yy_c_buf_p_offset;
  YY_BUFFER_STATE b;
  int num_to_read;
  int ret_val;
  int i;
  int number_to_move;
  char *source;
  char *dest;
  deci_FlexLexer *this_local;
  
  source = this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_ch_buf;
  _i = (this->super_FlexLexer).yytext;
  if (this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_ch_buf + (this->yy_n_chars + 1) <
      this->yy_c_buf_p) {
    (*(this->super_FlexLexer)._vptr_FlexLexer[0xe])
              (this,"fatal flex scanner internal error--end of buffer missed");
  }
  if (this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_fill_buffer == 0) {
    if ((long)this->yy_c_buf_p - (long)(this->super_FlexLexer).yytext == 1) {
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = 2;
    }
  }
  else {
    iVar3 = ((int)this->yy_c_buf_p - (int)(this->super_FlexLexer).yytext) + -1;
    for (num_to_read = 0; num_to_read < iVar3; num_to_read = num_to_read + 1) {
      *source = *_i;
      _i = _i + 1;
      source = source + 1;
    }
    if (this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_buffer_status == 2) {
      this->yy_n_chars = 0;
      this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_n_chars = 0;
    }
    else {
      iVar4 = this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_buf_size - iVar3;
      while (b._0_4_ = iVar4 - 1, (int)(uint)b < 1) {
        pyVar1 = this->yy_buffer_stack[this->yy_buffer_stack_top];
        pcVar6 = this->yy_c_buf_p;
        pcVar2 = pyVar1->yy_ch_buf;
        if (pyVar1->yy_is_our_buffer == 0) {
          pyVar1->yy_ch_buf = (char *)0x0;
        }
        else {
          if (pyVar1->yy_buf_size << 1 < 1) {
            pyVar1->yy_buf_size = pyVar1->yy_buf_size / 8 + pyVar1->yy_buf_size;
          }
          else {
            pyVar1->yy_buf_size = pyVar1->yy_buf_size << 1;
          }
          pcVar5 = (char *)deci_realloc(pyVar1->yy_ch_buf,(long)(pyVar1->yy_buf_size + 2));
          pyVar1->yy_ch_buf = pcVar5;
        }
        if (pyVar1->yy_ch_buf == (char *)0x0) {
          (*(this->super_FlexLexer)._vptr_FlexLexer[0xe])
                    (this,"fatal error - scanner input buffer overflow");
        }
        this->yy_c_buf_p = pyVar1->yy_ch_buf + ((int)pcVar6 - (int)pcVar2);
        iVar4 = this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_buf_size - iVar3;
      }
      if (0x2000 < (int)(uint)b) {
        b._0_4_ = 0x2000;
      }
      iVar4 = (*(this->super_FlexLexer)._vptr_FlexLexer[0xc])
                        (this,this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_ch_buf + iVar3,
                         (ulong)(uint)b);
      this->yy_n_chars = iVar4;
      if (iVar4 < 0) {
        (*(this->super_FlexLexer)._vptr_FlexLexer[0xe])(this,"input in flex scanner failed");
      }
      this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_n_chars = this->yy_n_chars;
    }
    if (this->yy_n_chars == 0) {
      if (iVar3 == 0) {
        b._4_4_ = 1;
        (*(this->super_FlexLexer)._vptr_FlexLexer[7])(this,&this->yyin);
      }
      else {
        b._4_4_ = 2;
        this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_buffer_status = 2;
      }
    }
    else {
      b._4_4_ = 0;
    }
    if (this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_buf_size < this->yy_n_chars + iVar3) {
      iVar4 = this->yy_n_chars + iVar3 + (this->yy_n_chars >> 1);
      pcVar6 = (char *)deci_realloc(this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_ch_buf,
                                    (long)iVar4);
      this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_ch_buf = pcVar6;
      if (this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_ch_buf == (char *)0x0) {
        (*(this->super_FlexLexer)._vptr_FlexLexer[0xe])
                  (this,"out of dynamic memory in yy_get_next_buffer()");
      }
      this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_buf_size = iVar4 + -2;
    }
    this->yy_n_chars = iVar3 + this->yy_n_chars;
    this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_ch_buf[this->yy_n_chars] = '\0';
    this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_ch_buf[this->yy_n_chars + 1] = '\0';
    (this->super_FlexLexer).yytext = this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_ch_buf;
    this_local._4_4_ = b._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

int yyFlexLexer::yy_get_next_buffer()
{
    	char *dest = YY_CURRENT_BUFFER_LVALUE->yy_ch_buf;
	char *source = (yytext_ptr);
	int number_to_move, i;
	int ret_val;

	if ( (yy_c_buf_p) > &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars) + 1] )
		YY_FATAL_ERROR(
		"fatal flex scanner internal error--end of buffer missed" );

	if ( YY_CURRENT_BUFFER_LVALUE->yy_fill_buffer == 0 )
		{ /* Don't try to fill the buffer, so this is an EOF. */
		if ( (yy_c_buf_p) - (yytext_ptr) - YY_MORE_ADJ == 1 )
			{
			/* We matched a single character, the EOB, so
			 * treat this as a final EOF.
			 */
			return EOB_ACT_END_OF_FILE;
			}

		else
			{
			/* We matched some text prior to the EOB, first
			 * process it.
			 */
			return EOB_ACT_LAST_MATCH;
			}
		}

	/* Try to read more data. */

	/* First move last chars to start of buffer. */
	number_to_move = (int) ((yy_c_buf_p) - (yytext_ptr) - 1);

	for ( i = 0; i < number_to_move; ++i )
		*(dest++) = *(source++);

	if ( YY_CURRENT_BUFFER_LVALUE->yy_buffer_status == YY_BUFFER_EOF_PENDING )
		/* don't do the read, it's not guaranteed to return an EOF,
		 * just force an EOF
		 */
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = (yy_n_chars) = 0;

	else
		{
			int num_to_read =
			YY_CURRENT_BUFFER_LVALUE->yy_buf_size - number_to_move - 1;

		while ( num_to_read <= 0 )
			{ /* Not enough room in the buffer - grow it. */

			/* just a shorter name for the current buffer */
			YY_BUFFER_STATE b = YY_CURRENT_BUFFER_LVALUE;

			int yy_c_buf_p_offset =
				(int) ((yy_c_buf_p) - b->yy_ch_buf);

			if ( b->yy_is_our_buffer )
				{
				int new_size = b->yy_buf_size * 2;

				if ( new_size <= 0 )
					b->yy_buf_size += b->yy_buf_size / 8;
				else
					b->yy_buf_size *= 2;

				b->yy_ch_buf = (char *)
					/* Include room in for 2 EOB chars. */
					yyrealloc( (void *) b->yy_ch_buf,
							 (yy_size_t) (b->yy_buf_size + 2)  );
				}
			else
				/* Can't grow it, we don't own it. */
				b->yy_ch_buf = NULL;

			if ( ! b->yy_ch_buf )
				YY_FATAL_ERROR(
				"fatal error - scanner input buffer overflow" );

			(yy_c_buf_p) = &b->yy_ch_buf[yy_c_buf_p_offset];

			num_to_read = YY_CURRENT_BUFFER_LVALUE->yy_buf_size -
						number_to_move - 1;

			}

		if ( num_to_read > YY_READ_BUF_SIZE )
			num_to_read = YY_READ_BUF_SIZE;

		/* Read in more data. */
		YY_INPUT( (&YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[number_to_move]),
			(yy_n_chars), num_to_read );

		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = (yy_n_chars);
		}

	if ( (yy_n_chars) == 0 )
		{
		if ( number_to_move == YY_MORE_ADJ )
			{
			ret_val = EOB_ACT_END_OF_FILE;
			yyrestart( yyin  );
			}

		else
			{
			ret_val = EOB_ACT_LAST_MATCH;
			YY_CURRENT_BUFFER_LVALUE->yy_buffer_status =
				YY_BUFFER_EOF_PENDING;
			}
		}

	else
		ret_val = EOB_ACT_CONTINUE_SCAN;

	if (((yy_n_chars) + number_to_move) > YY_CURRENT_BUFFER_LVALUE->yy_buf_size) {
		/* Extend the array by 50%, plus the number we really need. */
		int new_size = (yy_n_chars) + number_to_move + ((yy_n_chars) >> 1);
		YY_CURRENT_BUFFER_LVALUE->yy_ch_buf = (char *) yyrealloc(
			(void *) YY_CURRENT_BUFFER_LVALUE->yy_ch_buf, (yy_size_t) new_size  );
		if ( ! YY_CURRENT_BUFFER_LVALUE->yy_ch_buf )
			YY_FATAL_ERROR( "out of dynamic memory in yy_get_next_buffer()" );
		/* "- 2" to take care of EOB's */
		YY_CURRENT_BUFFER_LVALUE->yy_buf_size = (int) (new_size - 2);
	}

	(yy_n_chars) += number_to_move;
	YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars)] = YY_END_OF_BUFFER_CHAR;
	YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars) + 1] = YY_END_OF_BUFFER_CHAR;

	(yytext_ptr) = &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[0];

	return ret_val;
}